

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigUnfold2.c
# Opt level: O1

Aig_Man_t * Saig_ManDupFoldConstrsFunc2(Aig_Man_t *pAig,int fCompl,int fVerbose,int typeII_cnt)

{
  char *pcVar1;
  void *pvVar2;
  uint uVar3;
  Aig_Man_t *pAVar4;
  size_t sVar5;
  char *pcVar6;
  Aig_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  Aig_Obj_t *pAVar12;
  int nRegs;
  int iVar13;
  long lVar14;
  
  if (pAig->nConstrs == 0) {
    pAVar4 = Aig_ManDupDfs(pAig);
    return pAVar4;
  }
  if (pAig->nTruePos <= pAig->nConstrs) {
    __assert_fail("Aig_ManConstrNum(pAig) < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigUnfold2.c"
                  ,0x17f,"Aig_Man_t *Saig_ManDupFoldConstrsFunc2(Aig_Man_t *, int, int, int)");
  }
  pAVar4 = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
  pcVar1 = pAig->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  pAVar4->pName = pcVar6;
  pcVar1 = pAig->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  pAVar4->pSpec = pcVar6;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pAVar4->pConst1;
  pVVar8 = pAig->vCis;
  if (0 < pVVar8->nSize) {
    lVar14 = 0;
    do {
      pvVar2 = pVVar8->pArray[lVar14];
      pAVar7 = Aig_ObjCreateCi(pAVar4);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar7;
      lVar14 = lVar14 + 1;
      pVVar8 = pAig->vCis;
    } while (lVar14 < pVVar8->nSize);
  }
  pVVar8 = pAig->vObjs;
  if (0 < pVVar8->nSize) {
    lVar14 = 0;
    do {
      pvVar2 = pVVar8->pArray[lVar14];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006d638e;
        uVar9 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar9 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar9 + 0x28));
        }
        uVar9 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar9 == 0) {
          pAVar12 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar12 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar9 + 0x28));
        }
        pAVar7 = Aig_And(pAVar4,pAVar7,pAVar12);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar7;
      }
      lVar14 = lVar14 + 1;
      pVVar8 = pAig->vObjs;
    } while (lVar14 < pVVar8->nSize);
  }
  pAVar7 = (Aig_Obj_t *)((ulong)pAVar4->pConst1 ^ 1);
  uVar9 = (ulong)(uint)pAig->nTruePos;
  if (0 < pAig->nTruePos) {
    lVar14 = 0;
    do {
      if (pAig->vCos->nSize <= lVar14) goto LAB_006d636f;
      if ((long)(int)uVar9 - (long)pAig->nConstrs <= lVar14) {
        pvVar2 = pAig->vCos->pArray[lVar14];
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006d638e;
        uVar9 = *(ulong *)((long)pvVar2 + 8);
        uVar10 = uVar9 & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          uVar9 = 0;
        }
        else {
          uVar9 = (ulong)((uint)uVar9 & 1) ^ *(ulong *)(uVar10 + 0x28);
        }
        pAVar7 = Aig_Or(pAVar4,pAVar7,(Aig_Obj_t *)(uVar9 ^ (long)fCompl));
      }
      lVar14 = lVar14 + 1;
      uVar9 = (ulong)pAig->nTruePos;
    } while (lVar14 < (long)uVar9);
  }
  if (0 < pAig->nRegs) {
    pAVar12 = Aig_ObjCreateCi(pAVar4);
    pAVar7 = Aig_Or(pAVar4,pAVar7,pAVar12);
  }
  uVar9 = (ulong)(uint)pAig->nTruePos;
  if (0 < pAig->nTruePos) {
    lVar14 = 0;
    do {
      if (pAig->vCos->nSize <= lVar14) goto LAB_006d636f;
      if (lVar14 < (long)(int)uVar9 - (long)pAig->nConstrs) {
        pvVar2 = pAig->vCos->pArray[lVar14];
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006d638e;
        uVar9 = *(ulong *)((long)pvVar2 + 8);
        uVar10 = uVar9 & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          pAVar12 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar12 = (Aig_Obj_t *)((ulong)((uint)uVar9 & 1) ^ *(ulong *)(uVar10 + 0x28));
        }
        pAVar12 = Aig_And(pAVar4,pAVar12,(Aig_Obj_t *)((ulong)pAVar7 ^ 1));
        Aig_ObjCreateCo(pAVar4,pAVar12);
      }
      lVar14 = lVar14 + 1;
      uVar9 = (ulong)pAig->nTruePos;
    } while (lVar14 < (long)uVar9);
  }
  nRegs = pAig->nRegs;
  if (0 < nRegs) {
    iVar13 = 0;
    do {
      uVar11 = pAig->nTruePos + iVar13;
      if (((((int)uVar11 < 0) || (pAig->vCos->nSize <= (int)uVar11)) ||
          (uVar3 = pAig->nTruePis + iVar13, (int)uVar3 < 0)) || (pAig->vCis->nSize <= (int)uVar3))
      goto LAB_006d636f;
      pvVar2 = pAig->vCos->pArray[uVar11];
      if (((ulong)pvVar2 & 1) != 0) {
LAB_006d638e:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar9 = *(ulong *)((long)pvVar2 + 8);
      uVar10 = uVar9 & 0xfffffffffffffffe;
      if (uVar10 == 0) {
        pAVar12 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar12 = (Aig_Obj_t *)((ulong)((uint)uVar9 & 1) ^ *(ulong *)(uVar10 + 0x28));
      }
      pAVar12 = Aig_Mux(pAVar4,(Aig_Obj_t *)((ulong)pAVar7 ^ 1),pAVar12,
                        *(Aig_Obj_t **)((long)pAig->vCis->pArray[uVar3] + 0x28));
      Aig_ObjCreateCo(pAVar4,pAVar12);
      iVar13 = iVar13 + 1;
      nRegs = pAig->nRegs;
    } while (iVar13 < nRegs);
  }
  Aig_ManSetRegNum(pAVar4,nRegs);
  if (0 < pAig->nTruePos) {
    lVar14 = 0;
    do {
      if (pAig->vCos->nSize <= lVar14) {
LAB_006d636f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < pAig->nTruePos);
  }
  if (0 < pAig->nRegs) {
    Aig_ObjCreateCo(pAVar4,pAVar7);
    Aig_ManSetRegNum(pAVar4,pAVar4->nRegs + 1);
  }
  printf("#reg after fold2: %d\n",(ulong)(uint)pAVar4->nRegs);
  Aig_ManCleanup(pAVar4);
  Aig_ManSeqCleanup(pAVar4);
  return pAVar4;
}

Assistant:

Aig_Man_t * Saig_ManDupFoldConstrsFunc2( Aig_Man_t * pAig, int fCompl, int fVerbose , 
                                         int typeII_cnt)
{
  Aig_Man_t * pAigNew;
  Aig_Obj_t * pMiter, * pFlopOut, * pFlopIn, * pObj;
  int i, typeII_cc, type_II;
  if ( Aig_ManConstrNum(pAig) == 0 )
    return Aig_ManDupDfs( pAig );
  assert( Aig_ManConstrNum(pAig) < Saig_ManPoNum(pAig) );
  // start the new manager
  pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
  pAigNew->pName = Abc_UtilStrsav( pAig->pName );
  pAigNew->pSpec = Abc_UtilStrsav( pAig->pSpec );
  // map the constant node
  Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
  // create variables for PIs
  Aig_ManForEachCi( pAig, pObj, i )
    pObj->pData = Aig_ObjCreateCi( pAigNew );
  // add internal nodes of this frame
  Aig_ManForEachNode( pAig, pObj, i )
    pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );

  // OR the constraint outputs
  pMiter = Aig_ManConst0( pAigNew );
  typeII_cc = 0;//typeII_cnt;
  typeII_cnt = 0;  
  type_II = 0;
    
  Saig_ManForEachPo( pAig, pObj, i )
    {
      
      if ( i < Saig_ManPoNum(pAig)-Aig_ManConstrNum(pAig) )
        continue;
      if (i + typeII_cnt >= Saig_ManPoNum(pAig) ) {
        type_II = 1;
      }
      /*  now we got the constraint */
      if (type_II) {

        Aig_Obj_t * type_II_latch
          = Aig_ObjCreateCi(pAigNew); /* will get connected later; */
        pMiter = Aig_Or(pAigNew, pMiter, 
                        Aig_And(pAigNew, 
                                Aig_NotCond(type_II_latch, fCompl),
                                Aig_NotCond( Aig_ObjChild0Copy(pObj), fCompl ) )
                        );
        printf( "modeling typeII : %d:%s%d \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
      } else 
        pMiter = Aig_Or( pAigNew, pMiter, Aig_NotCond( Aig_ObjChild0Copy(pObj), fCompl ) );
    }

  // create additional flop
  if ( Saig_ManRegNum(pAig) > 0 )
    {
      pFlopOut = Aig_ObjCreateCi( pAigNew );
      pFlopIn  = Aig_Or( pAigNew, pMiter, pFlopOut );
    }
  else 
    pFlopIn = pMiter;

  // create primary output
  Saig_ManForEachPo( pAig, pObj, i )
    {
      if ( i >= Saig_ManPoNum(pAig)-Aig_ManConstrNum(pAig) )
        continue;
      pMiter = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_Not(pFlopIn) );
      Aig_ObjCreateCo( pAigNew, pMiter );
    }

  // transfer to register outputs
  {
    /* the same for type I and type II */
    Aig_Obj_t * pObjLi, *pObjLo;

    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )    {
      if( i + typeII_cc < Aig_ManRegNum(pAig)) {
        Aig_Obj_t *c = Aig_Mux(pAigNew, Aig_Not(pFlopIn), 
                               Aig_ObjChild0Copy(pObjLi) ,
                               (Aig_Obj_t*)pObjLo->pData);
        Aig_ObjCreateCo( pAigNew, c);
      } else {
        printf ( "skipping: reg%d\n", i);
        Aig_ObjCreateCo( pAigNew,Aig_ObjChild0Copy(pObjLi));
      }
    }

  }
  if(0)Saig_ManForEachLi( pAig, pObj, i ) {
      Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    }
  Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    
  type_II = 0;
  Saig_ManForEachPo( pAig, pObj, i )
    {
    
      if ( i < Saig_ManPoNum(pAig)-Aig_ManConstrNum(pAig) )
        continue;
      if (i + typeII_cnt >= Saig_ManPoNum(pAig) ) {
        type_II = 1;
      }
      /*  now we got the constraint */
      if (type_II) {
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj));
        Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAigNew)+1 );
        printf( "Latch for typeII : %d:%s%d \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
      }
    }

     
  // create additional flop 

  if ( Saig_ManRegNum(pAig) > 0 )
    {
      Aig_ObjCreateCo( pAigNew, pFlopIn );
      Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAigNew)+1 );
    }
  printf("#reg after fold2: %d\n", Aig_ManRegNum(pAigNew));
  // perform cleanup
  Aig_ManCleanup( pAigNew );
  Aig_ManSeqCleanup( pAigNew );
  return pAigNew;
}